

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

void secp256k1_modinv32(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar37;
  uint uVar38;
  uint uVar39;
  undefined4 uVar40;
  uint extraout_EAX;
  long lVar41;
  int iVar42;
  ulong uVar43;
  secp256k1_modinv32_signed30 *b;
  uint uVar44;
  int extraout_EDX;
  uint uVar45;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar46;
  secp256k1_modinv32_signed30 *a;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar47;
  long lVar48;
  secp256k1_modinv32_signed30 *b_00;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  uint uVar55;
  secp256k1_modinv32_signed30 *unaff_RBX;
  int *piVar56;
  secp256k1_modinv32_signed30 *psVar57;
  secp256k1_fe *r;
  ulong uVar58;
  ulong uVar59;
  uint64_t uVar60;
  secp256k1_fe *a_00;
  ulong uVar61;
  secp256k1_fe *a_01;
  secp256k1_modinv32_signed30 *psVar62;
  secp256k1_modinv32_signed30 *a_02;
  secp256k1_modinv32_signed30 *a_03;
  long lVar63;
  ulong uVar64;
  secp256k1_fe *r_00;
  secp256k1_fe *r_01;
  ulong uVar65;
  ulong uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  ulong uVar75;
  uint uVar76;
  int *piVar77;
  long lVar78;
  uint uVar79;
  uint uVar80;
  ulong uVar81;
  secp256k1_modinv32_signed30 *psVar82;
  uint uVar83;
  secp256k1_modinv32_modinfo *unaff_R13;
  secp256k1_modinv32_modinfo *psVar84;
  secp256k1_modinv32_signed30 *psVar85;
  uint uVar86;
  secp256k1_modinv32_signed30 *unaff_R14;
  uint64_t uVar87;
  secp256k1_fe *a_04;
  uint uVar88;
  ulong unaff_R15;
  uint64_t uVar89;
  code *pcVar90;
  code *pcVar91;
  bool bVar92;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  undefined1 auVar93 [16];
  uint extraout_XMM0_Dd;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  uint32_t c1;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 d;
  uchar auStack_458 [32];
  secp256k1_fe *psStack_438;
  ulong uStack_430;
  ulong uStack_428;
  secp256k1_fe *psStack_420;
  code *pcStack_418;
  code *pcStack_408;
  undefined1 auStack_400 [32];
  secp256k1_fe sStack_3e0;
  undefined1 auStack_3b0 [16];
  secp256k1_fe sStack_398;
  ulong uStack_368;
  secp256k1_fe *psStack_360;
  uint64_t uStack_358;
  code *pcStack_350;
  long lStack_340;
  secp256k1_fe sStack_338;
  secp256k1_fe *psStack_300;
  secp256k1_fe sStack_2f8;
  secp256k1_fe sStack_2c8;
  ulong uStack_290;
  ulong uStack_288;
  ulong uStack_280;
  secp256k1_modinv32_signed30 *psStack_278;
  ulong uStack_270;
  code *pcStack_268;
  uint uStack_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  secp256k1_modinv32_signed30 *psStack_248;
  uint uStack_23c;
  uint uStack_238;
  uint uStack_234;
  uint uStack_230;
  int32_t iStack_22c;
  secp256k1_modinv32_signed30 *psStack_228;
  secp256k1_modinv32_signed30 *psStack_220;
  secp256k1_modinv32_signed30 *psStack_218;
  secp256k1_modinv32_signed30 *psStack_210;
  secp256k1_modinv32_signed30 *psStack_208;
  code *pcStack_200;
  long lStack_1f0;
  long lStack_1e8;
  int *piStack_1e0;
  ulong uStack_1d8;
  secp256k1_modinv32_modinfo *psStack_1d0;
  ulong uStack_1c0;
  code *pcStack_1b8;
  secp256k1_modinv32_signed30 *psStack_1b0;
  int *piStack_1a0;
  ulong uStack_198;
  secp256k1_modinv32_modinfo *psStack_190;
  ulong uStack_180;
  code *pcStack_178;
  secp256k1_modinv32_signed30 sStack_170;
  secp256k1_modinv32_signed30 sStack_14c;
  secp256k1_modinv32_signed30 *psStack_128;
  secp256k1_modinv32_signed30 *psStack_120;
  secp256k1_modinv32_modinfo *local_110;
  int local_104;
  uint local_100;
  uint local_fc;
  secp256k1_modinv32_trans2x2 local_f8;
  secp256k1_modinv32_signed30 local_e8;
  secp256k1_modinv32_signed30 *local_c0;
  long local_b8;
  undefined8 local_b0;
  secp256k1_modinv32_signed30 local_a8;
  secp256k1_modinv32_signed30 local_78;
  secp256k1_modinv32_signed30 local_54;
  
  local_78.v[4] = 0;
  local_78.v[5] = 0;
  local_78.v[6] = 0;
  local_78.v[7] = 0;
  local_78.v[0] = 0;
  local_78.v[1] = 0;
  local_78.v[2] = 0;
  local_78.v[3] = 0;
  local_78.v[8] = 0;
  local_54.v[5] = 0;
  local_54.v[6] = 0;
  local_54.v[7] = 0;
  local_54.v[8] = 0;
  local_54.v[1] = 0;
  local_54.v[2] = 0;
  local_54.v[3] = 0;
  local_54.v[4] = 0;
  local_54.v[0] = 1;
  local_e8.v[8] = (modinfo->modulus).v[8];
  local_e8.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_e8.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_e8.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_e8.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_a8.v[8] = x->v[8];
  local_a8.v._0_8_ = *(undefined8 *)x->v;
  local_a8.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_a8.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_a8.v._24_8_ = *(undefined8 *)(x->v + 6);
  iVar37 = 0;
  uVar81 = 0xffffffff;
  local_110 = modinfo;
  local_c0 = x;
  do {
    local_b0 = (ulong)local_e8.v[0];
    uVar58 = (ulong)local_a8.v[0];
    uVar43 = 0;
    psVar62 = (secp256k1_modinv32_signed30 *)0x1;
    uVar38 = 0;
    uVar44 = 0;
    uVar67 = 1;
    uVar71 = local_a8.v[0];
    uVar76 = local_e8.v[0];
    do {
      uVar39 = local_e8.v[0];
      local_104 = iVar37;
      if ((uVar76 & 1) == 0) {
        psStack_120 = (secp256k1_modinv32_signed30 *)0x155db2;
        secp256k1_modinv32_cold_17();
LAB_00155db2:
        psStack_120 = (secp256k1_modinv32_signed30 *)0x155db7;
        secp256k1_modinv32_cold_1();
LAB_00155db7:
        psStack_120 = (secp256k1_modinv32_signed30 *)0x155dbc;
        secp256k1_modinv32_cold_2();
        psVar84 = unaff_R13;
LAB_00155dbc:
        uVar67 = uVar39;
        psStack_120 = (secp256k1_modinv32_signed30 *)0x155dc1;
        secp256k1_modinv32_cold_16();
        goto LAB_00155dc1;
      }
      uVar45 = (uint)psVar62;
      uVar86 = uVar38 * local_a8.v[0] + uVar45 * local_e8.v[0];
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)uVar86;
      uVar55 = uVar76 << ((byte)uVar43 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar55;
      if (uVar86 != uVar55) goto LAB_00155db2;
      uVar86 = uVar67 * local_a8.v[0] + uVar44 * local_e8.v[0];
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)uVar86;
      uVar55 = uVar71 << ((byte)uVar43 & 0x1f);
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar55;
      if (uVar86 != uVar55) goto LAB_00155db7;
      local_fc = (int)(uint)uVar81 >> 0x1f;
      unaff_R14 = (secp256k1_modinv32_signed30 *)(ulong)local_fc;
      local_100 = uVar71 & 1;
      uVar55 = -local_100;
      unaff_R15 = (ulong)uVar55;
      uVar86 = local_fc & uVar55;
      unaff_RBX = (secp256k1_modinv32_signed30 *)(ulong)uVar86;
      uVar79 = (uint)uVar81 ^ uVar86;
      uVar81 = (ulong)uVar79;
      psVar84 = (secp256k1_modinv32_modinfo *)(ulong)(uVar79 - 0x25b);
      if (uVar79 - 0x25b < 0xfffffb4d) goto LAB_00155dbc;
      uVar81 = (ulong)(uVar79 - 1);
      uVar67 = uVar67 + ((local_fc ^ uVar38) - local_fc & uVar55);
      uVar38 = (uVar38 + (uVar67 & uVar86)) * 2;
      uVar44 = uVar44 + ((local_fc ^ uVar45) - local_fc & uVar55);
      uVar39 = (uVar45 + (uVar44 & uVar86)) * 2;
      psVar62 = (secp256k1_modinv32_signed30 *)(ulong)uVar39;
      uVar55 = ((local_fc ^ uVar76) - local_fc & uVar55) + uVar71;
      uVar71 = uVar55 >> 1;
      uVar55 = uVar55 & uVar86;
      unaff_R13 = (secp256k1_modinv32_modinfo *)(ulong)uVar55;
      uVar76 = uVar76 + uVar55;
      uVar55 = (int)uVar43 + 1;
      uVar43 = (ulong)uVar55;
    } while (uVar55 != 0x1e);
    unaff_R14 = (secp256k1_modinv32_signed30 *)(long)(int)uVar39;
    psVar84 = (secp256k1_modinv32_modinfo *)(long)(int)uVar38;
    unaff_R15 = (ulong)(int)uVar44;
    uVar43 = (long)unaff_R14 * (long)(int)uVar67 - (long)psVar84 * unaff_R15;
    local_f8.u = uVar39;
    local_f8.v = uVar38;
    local_f8.q = uVar44;
    local_f8.r = uVar67;
    if (uVar43 != 0x40000000) {
LAB_00155dc1:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155dc6;
      secp256k1_modinv32_cold_3();
LAB_00155dc6:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155dcb;
      secp256k1_modinv32_cold_15();
LAB_00155dcb:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155dd0;
      secp256k1_modinv32_cold_14();
LAB_00155dd0:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155dd5;
      secp256k1_modinv32_cold_13();
LAB_00155dd5:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155dda;
      secp256k1_modinv32_cold_12();
LAB_00155dda:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155ddf;
      secp256k1_modinv32_cold_4();
LAB_00155ddf:
      unaff_R13 = psVar84;
      uVar38 = (uint)uVar43;
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155de4;
      secp256k1_modinv32_cold_5();
LAB_00155de4:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155de9;
      secp256k1_modinv32_cold_11();
LAB_00155de9:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155dee;
      secp256k1_modinv32_cold_10();
LAB_00155dee:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155df3;
      secp256k1_modinv32_cold_9();
LAB_00155df3:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155df8;
      secp256k1_modinv32_cold_8();
      goto LAB_00155df8;
    }
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155ac7;
    local_b8 = (long)(int)uVar67;
    secp256k1_modinv32_update_de_30(&local_78,&local_54,&local_f8,local_110);
    unaff_RBX = &local_e8;
    uVar67 = 9;
    uVar43 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155ae3;
    psVar62 = unaff_RBX;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,-1);
    if (iVar37 < 1) goto LAB_00155dc6;
    uVar67 = 9;
    uVar43 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155b02;
    psVar62 = unaff_RBX;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,1);
    if (0 < iVar37) goto LAB_00155dcb;
    unaff_RBX = &local_a8;
    uVar67 = 9;
    uVar43 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155b26;
    psVar62 = unaff_RBX;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,-1);
    if (iVar37 < 1) goto LAB_00155dd0;
    uVar67 = 9;
    uVar43 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155b45;
    psVar62 = unaff_RBX;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_RBX,9,&local_110->modulus,1);
    unaff_R13 = local_110;
    if (-1 < iVar37) goto LAB_00155dd5;
    unaff_RBX = (secp256k1_modinv32_signed30 *)((long)psVar84 * uVar58 + (long)unaff_R14 * local_b0)
    ;
    uVar43 = local_b0;
    if (((ulong)unaff_RBX & 0x3ffffffe) != 0) goto LAB_00155dda;
    uVar43 = local_b0 * unaff_R15;
    uVar58 = uVar58 * local_b8 + uVar43;
    if ((uVar58 & 0x3fffffff) != 0) goto LAB_00155ddf;
    uVar58 = (long)uVar58 >> 0x1e;
    unaff_RBX = (secp256k1_modinv32_signed30 *)((long)unaff_RBX >> 0x1e);
    lVar41 = 1;
    do {
      lVar78 = (long)unaff_RBX->v +
               (long)local_a8.v[lVar41] * (long)psVar84 + (long)local_e8.v[lVar41] * (long)unaff_R14
      ;
      lVar46 = local_a8.v[lVar41] * local_b8 + (long)local_e8.v[lVar41] * unaff_R15 + uVar58;
      local_e8.v[lVar41 + -1] = (uint)lVar78 & 0x3fffffff;
      *(uint *)((long)&local_b0 + lVar41 * 4 + 4) = (uint)lVar46 & 0x3fffffff;
      lVar41 = lVar41 + 1;
      uVar58 = lVar46 >> 0x1e;
      unaff_RBX = (secp256k1_modinv32_signed30 *)(lVar78 >> 0x1e);
    } while (lVar41 != 9);
    local_a8.v[8] = (int32_t)uVar58;
    unaff_R14 = &local_e8;
    uVar67 = 9;
    uVar38 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155c17;
    psVar62 = unaff_R14;
    local_e8.v[8] = (int32_t)unaff_RBX;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&local_110->modulus,-1);
    if (iVar37 < 1) goto LAB_00155de4;
    uVar67 = 9;
    uVar38 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155c34;
    psVar62 = unaff_R14;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&unaff_R13->modulus,1);
    if (0 < iVar37) goto LAB_00155de9;
    unaff_R14 = &local_a8;
    uVar67 = 9;
    uVar38 = 0xffffffff;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155c56;
    psVar62 = unaff_R14;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&unaff_R13->modulus,-1);
    if (iVar37 < 1) goto LAB_00155dee;
    uVar67 = 9;
    uVar38 = 1;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155c73;
    psVar62 = unaff_R14;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&unaff_R13->modulus,1);
    if (-1 < iVar37) goto LAB_00155df3;
    iVar37 = local_104 + 1;
  } while (iVar37 != 0x14);
  psVar62 = &local_a8;
  uVar67 = 9;
  uVar38 = 0;
  psStack_120 = (secp256k1_modinv32_signed30 *)0x155ca2;
  iVar37 = secp256k1_modinv32_mul_cmp_30(psVar62,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar37 == 0) {
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155cc5;
    iVar37 = secp256k1_modinv32_mul_cmp_30(&local_e8,9,&SECP256K1_SIGNED30_ONE,-1);
    unaff_R14 = local_c0;
    if (iVar37 == 0) {
LAB_00155d6c:
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155d81;
      secp256k1_modinv32_normalize_30(&local_78,(int32_t)unaff_RBX,unaff_R13);
      unaff_R14->v[8] = local_78.v[8];
      *(undefined8 *)(unaff_R14->v + 4) = local_78.v._16_8_;
      *(undefined8 *)(unaff_R14->v + 6) = local_78.v._24_8_;
      *(undefined8 *)unaff_R14->v = local_78.v._0_8_;
      *(undefined8 *)(unaff_R14->v + 2) = local_78.v._8_8_;
      return;
    }
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155ced;
    iVar37 = secp256k1_modinv32_mul_cmp_30(&local_e8,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar37 == 0) goto LAB_00155d6c;
    uVar67 = 9;
    uVar38 = 0;
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155d07;
    psVar62 = unaff_R14;
    iVar37 = secp256k1_modinv32_mul_cmp_30(unaff_R14,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar37 == 0) {
      psVar62 = &local_78;
      uVar67 = 9;
      uVar38 = 0;
      psStack_120 = (secp256k1_modinv32_signed30 *)0x155d2a;
      iVar37 = secp256k1_modinv32_mul_cmp_30(psVar62,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar37 == 0) {
        psStack_120 = (secp256k1_modinv32_signed30 *)0x155d49;
        iVar37 = secp256k1_modinv32_mul_cmp_30(&local_e8,9,&unaff_R13->modulus,1);
        if (iVar37 == 0) goto LAB_00155d6c;
        psVar62 = &local_e8;
        uVar67 = 9;
        uVar38 = 0xffffffff;
        psStack_120 = (secp256k1_modinv32_signed30 *)0x155d64;
        iVar37 = secp256k1_modinv32_mul_cmp_30(psVar62,9,&unaff_R13->modulus,-1);
        if (iVar37 == 0) goto LAB_00155d6c;
      }
    }
  }
  else {
LAB_00155df8:
    psStack_120 = (secp256k1_modinv32_signed30 *)0x155dfd;
    secp256k1_modinv32_cold_6();
  }
  psStack_120 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_02 = &sStack_170;
  piVar56 = (int *)(ulong)uVar38;
  pcStack_178 = (code *)0x155e22;
  psStack_128 = unaff_RBX;
  psStack_120 = unaff_R14;
  secp256k1_modinv32_mul_30(&sStack_14c,psVar62,uVar67,1);
  pcStack_178 = (code *)0x155e34;
  piVar77 = piVar56;
  psVar62 = a;
  secp256k1_modinv32_mul_30(&sStack_170,a,9,uVar38);
  lVar41 = 0;
  while ((uint)sStack_14c.v[lVar41] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_170.v[lVar41]) goto LAB_00155e86;
    lVar41 = lVar41 + 1;
    if (lVar41 == 8) {
      uVar38 = 8;
      while( true ) {
        if (sStack_14c.v[uVar38] < sStack_170.v[uVar38]) {
          return;
        }
        if (sStack_170.v[uVar38] < sStack_14c.v[uVar38]) break;
        bVar92 = uVar38 == 0;
        uVar38 = uVar38 - 1;
        if (bVar92) {
          return;
        }
      }
      return;
    }
  }
  pcStack_178 = (code *)0x155e86;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_00155e86:
  pcStack_178 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar37 = (int)a_02;
  piStack_1a0 = piVar56;
  uStack_198 = uVar81;
  psStack_190 = unaff_R13;
  uStack_180 = unaff_R15;
  pcStack_178 = (code *)uVar58;
  if (iVar37 < 1) {
    psStack_1b0 = (secp256k1_modinv32_signed30 *)0x155f79;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_00155f79:
    iVar42 = (int)piVar77;
    psStack_1b0 = (secp256k1_modinv32_signed30 *)0x155f7e;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar1 = piVar77[1];
    iVar2 = *piVar77;
    piVar56 = (int *)(long)psVar62->v[0];
    uVar43 = (long)*extraout_RDX * (long)iVar1 + (long)piVar56 * (long)iVar2;
    if ((uVar43 & 0x3fffffff) != 0) goto LAB_00155f79;
    iVar3 = piVar77[3];
    iVar42 = piVar77[2];
    piVar56 = (int *)((long)piVar56 * (long)iVar42);
    piVar77 = (int *)((long)*extraout_RDX * (long)iVar3 + (long)piVar56);
    if (((ulong)piVar77 & 0x3fffffff) == 0) {
      lVar46 = (long)piVar77 >> 0x1e;
      lVar41 = (long)uVar43 >> 0x1e;
      if (iVar37 != 1) {
        uVar81 = 1;
        do {
          lVar41 = (long)extraout_RDX[uVar81] * (long)iVar1 +
                   (long)psVar62->v[uVar81] * (long)iVar2 + lVar41;
          lVar46 = (long)extraout_RDX[uVar81] * (long)iVar3 +
                   (long)psVar62->v[uVar81] * (long)iVar42 + lVar46;
          psVar62->v[uVar81 - 1] = (uint)lVar41 & 0x3fffffff;
          extraout_RDX[uVar81 - 1] = (uint)lVar46 & 0x3fffffff;
          uVar81 = uVar81 + 1;
          lVar46 = lVar46 >> 0x1e;
          lVar41 = lVar41 >> 0x1e;
        } while (((ulong)a_02 & 0xffffffff) != uVar81);
      }
      psVar62->v[(long)iVar37 + -1] = (int32_t)lVar41;
      extraout_RDX[(long)iVar37 + -1] = (int)lVar46;
      return;
    }
  }
  psStack_1b0 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar41 = 0;
  psStack_1b0 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar41 < extraout_EDX) {
      psStack_1b0 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_1b0->v + (long)psVar62->v[lVar41] * (long)iVar42);
    }
    a_02->v[lVar41] = (uint)psStack_1b0 & 0x3fffffff;
    psStack_1b0 = (secp256k1_modinv32_signed30 *)((long)psStack_1b0 >> 0x1e);
    lVar41 = lVar41 + 1;
  } while (lVar41 != 8);
  if (8 < extraout_EDX) {
    psStack_1b0 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_1b0->v + (long)psVar62->v[8] * (long)iVar42);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_1b0;
  if (b == psStack_1b0) {
    a_02->v[8] = (int)psStack_1b0;
    return;
  }
  pcStack_1b8 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar38 = *extraout_RDX_00;
  psVar85 = (secp256k1_modinv32_signed30 *)(long)(int)uVar38;
  uVar71 = extraout_RDX_00[1];
  lVar41 = (long)(int)uVar71;
  uVar76 = extraout_RDX_00[2];
  psVar57 = (secp256k1_modinv32_signed30 *)(long)(int)uVar76;
  lStack_1f0 = (long)(int)extraout_RDX_00[3];
  a_00 = (secp256k1_fe *)0x9;
  pcStack_200 = (code *)0x156018;
  a_03 = a_02;
  piStack_1e0 = piVar56;
  uStack_1d8 = uVar81;
  psStack_1d0 = unaff_R13;
  uStack_1c0 = unaff_R15;
  pcStack_1b8 = (code *)uVar58;
  iVar37 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
  if (iVar37 < 1) {
    pcStack_200 = (code *)0x156280;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_00156280:
    pcStack_200 = (code *)0x156285;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_00156285:
    pcStack_200 = (code *)0x15628a;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0015628a:
    pcStack_200 = (code *)0x15628f;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0015628f:
    pcStack_200 = (code *)0x156294;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_00156294:
    pcStack_200 = (code *)0x156299;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_00156299:
    pcStack_200 = (code *)0x15629e;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0015629e:
    pcStack_200 = (code *)0x1562a3;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar82 = b;
LAB_001562a3:
    pcStack_200 = (code *)0x1562a8;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_001562a8:
    pcStack_200 = (code *)0x1562ad;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_001562ad:
    pcStack_200 = (code *)0x1562b2;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    a_00 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x156035;
    a_03 = a_02;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar37) goto LAB_00156280;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x156052;
    a_03 = psVar62;
    iVar37 = secp256k1_modinv32_mul_cmp_30(psVar62,9,b,-2);
    if (iVar37 < 1) goto LAB_00156285;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x15606f;
    a_03 = psVar62;
    iVar37 = secp256k1_modinv32_mul_cmp_30(psVar62,9,b,1);
    if (-1 < iVar37) goto LAB_0015628a;
    psVar82 = (secp256k1_modinv32_signed30 *)-(long)psVar85;
    if (0 < (long)psVar85) {
      psVar82 = psVar85;
    }
    lVar46 = -lVar41;
    if (lVar41 < 1) {
      lVar46 = lVar41;
    }
    if (lVar46 + 0x40000000 < (long)psVar82) goto LAB_0015628f;
    psVar82 = (secp256k1_modinv32_signed30 *)-(long)psVar57;
    if (0 < (long)psVar57) {
      psVar82 = psVar57;
    }
    lVar46 = -lStack_1f0;
    if (lStack_1f0 < 1) {
      lVar46 = lStack_1f0;
    }
    if (lVar46 + 0x40000000 < (long)psVar82) goto LAB_00156294;
    uVar67 = a_02->v[8] >> 0x1f;
    uVar44 = psVar62->v[8] >> 0x1f;
    a_00 = (secp256k1_fe *)(ulong)uVar44;
    iVar37 = (uVar44 & uVar71) + (uVar67 & uVar38);
    a_03 = (secp256k1_modinv32_signed30 *)
           (psVar62->v[0] * lVar41 + (long)a_02->v[0] * (long)psVar85);
    lVar46 = (long)(int)(iVar37 - ((int)a_03 * b[1].v[0] + iVar37 & 0x3fffffffU));
    piVar47 = (int32_t *)((long)a_03->v + lVar46 * b->v[0]);
    if (((ulong)piVar47 & 0x3fffffff) != 0) goto LAB_00156299;
    lStack_1e8 = lVar46;
    iVar37 = (uVar44 & (uint)lStack_1f0) + (uVar67 & uVar76);
    lVar78 = psVar62->v[0] * lStack_1f0 + (long)a_02->v[0] * (long)psVar57;
    a_03 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar38 = iVar37 - (b[1].v[0] * (int)lVar78 + iVar37 & 0x3fffffffU);
    a_00 = (secp256k1_fe *)(ulong)uVar38;
    uVar81 = (long)b->v[0] * (long)(int)uVar38 + lVar78;
    if ((uVar81 & 0x3fffffff) != 0) goto LAB_0015629e;
    lVar78 = (long)uVar81 >> 0x1e;
    lVar48 = (long)piVar47 >> 0x1e;
    lVar63 = 1;
    do {
      lVar48 = b->v[lVar63] * lVar46 + psVar62->v[lVar63] * lVar41 +
               (long)a_02->v[lVar63] * (long)psVar85 + lVar48;
      psVar82 = (secp256k1_modinv32_signed30 *)(psVar62->v[lVar63] * lStack_1f0);
      lVar78 = (long)psVar82->v +
               (long)a_02->v[lVar63] * (long)psVar57 + lVar78 +
               (long)b->v[lVar63] * (long)(int)uVar38;
      a_02->v[lVar63 + -1] = (uint)lVar48 & 0x3fffffff;
      psVar62->v[lVar63 + -1] = (uint)lVar78 & 0x3fffffff;
      lVar63 = lVar63 + 1;
      lVar78 = lVar78 >> 0x1e;
      lVar48 = lVar48 >> 0x1e;
    } while (lVar63 != 9);
    a_02->v[8] = (int32_t)lVar48;
    psVar62->v[8] = (int32_t)lVar78;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x156219;
    a_03 = a_02;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
    psVar57 = psVar62;
    psVar85 = b;
    if (iVar37 < 1) goto LAB_001562a3;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x156236;
    a_03 = a_02;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar37) goto LAB_001562a8;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x15624f;
    a_03 = psVar62;
    iVar37 = secp256k1_modinv32_mul_cmp_30(psVar62,9,b,-2);
    if (iVar37 < 1) goto LAB_001562ad;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_200 = (code *)0x156268;
    a_03 = psVar62;
    iVar37 = secp256k1_modinv32_mul_cmp_30(psVar62,9,b,1);
    if (iVar37 < 0) {
      return;
    }
  }
  pcStack_200 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_200 = (code *)lVar41;
  psStack_208 = a_02;
  psStack_210 = psVar62;
  psStack_218 = psVar85;
  psStack_220 = psVar82;
  psStack_228 = psVar57;
  uVar38 = a_03->v[0];
  uVar49 = (ulong)uVar38;
  uVar71 = a_03->v[3];
  uVar59 = (ulong)uVar71;
  uVar76 = a_03->v[4];
  uVar43 = (ulong)uVar76;
  uVar44 = a_03->v[5];
  uVar58 = (ulong)uVar44;
  psVar62 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_03->v[6];
  uVar67 = a_03->v[7];
  uVar81 = (ulong)uVar67;
  iStack_22c = a_03->v[8];
  lVar41 = 0;
  do {
    if (a_03->v[lVar41] < -0x3fffffff) {
      pcStack_268 = (code *)0x156600;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_00156600:
      pcStack_268 = (code *)0x156605;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_00156605;
    }
    if (0x3fffffff < a_03->v[lVar41]) goto LAB_00156600;
    lVar41 = lVar41 + 1;
  } while (lVar41 != 9);
  uStack_24c = (uint)a_00;
  a_00 = (secp256k1_fe *)0x9;
  pcStack_268 = (code *)0x15633d;
  psVar62 = a_03;
  uStack_258 = a_03->v[1];
  uStack_254 = a_03->v[2];
  uStack_250 = a_03->v[6];
  psStack_248 = b_00;
  iVar37 = secp256k1_modinv32_mul_cmp_30(a_03,9,b_00,-2);
  if (iVar37 < 1) {
LAB_00156605:
    pcStack_268 = (code *)0x15660a;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0015660a:
    pcStack_268 = (code *)0x15660f;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0015660f:
    pcStack_268 = (code *)0x156614;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_00156614:
    pcStack_268 = (code *)0x156619;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    a_00 = (secp256k1_fe *)0x9;
    pcStack_268 = (code *)0x15635c;
    psVar62 = a_03;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_248,1);
    if (-1 < iVar37) goto LAB_0015660a;
    uVar39 = iStack_22c >> 0x1f;
    uStack_230 = psStack_248->v[1];
    uVar55 = (uVar39 & uStack_230) + uStack_258;
    uStack_258 = psStack_248->v[2];
    uVar45 = (uVar39 & uStack_258) + uStack_254;
    uStack_254 = psStack_248->v[3];
    uStack_234 = psStack_248->v[4];
    uStack_238 = psStack_248->v[5];
    uStack_23c = psStack_248->v[6];
    uVar83 = (uVar39 & uStack_23c) + uStack_250;
    uStack_250 = psStack_248->v[7];
    uStack_25c = (int)uStack_24c >> 0x1f;
    uStack_24c = psStack_248->v[8];
    uVar79 = ((uVar39 & psStack_248->v[0]) + uVar38 ^ uStack_25c) - uStack_25c;
    uVar86 = ((int)uVar79 >> 0x1e) + ((uVar55 ^ uStack_25c) - uStack_25c);
    uVar55 = ((int)uVar86 >> 0x1e) + ((uVar45 ^ uStack_25c) - uStack_25c);
    uVar88 = ((int)uVar55 >> 0x1e) + (((uVar39 & uStack_254) + uVar71 ^ uStack_25c) - uStack_25c);
    uVar71 = ((int)uVar88 >> 0x1e) + (((uVar39 & uStack_234) + uVar76 ^ uStack_25c) - uStack_25c);
    uVar38 = ((int)uVar71 >> 0x1e) + (((uVar39 & uStack_238) + uVar44 ^ uStack_25c) - uStack_25c);
    uVar76 = ((int)uVar38 >> 0x1e) + ((uVar83 ^ uStack_25c) - uStack_25c);
    uVar44 = ((int)uVar76 >> 0x1e) + (((uVar39 & uStack_250) + uVar67 ^ uStack_25c) - uStack_25c);
    uVar80 = ((int)uVar44 >> 0x1e) +
             (((uVar39 & uStack_24c) + iStack_22c ^ uStack_25c) - uStack_25c);
    uVar58 = (ulong)uVar80;
    uStack_260 = (int)uVar80 >> 0x1f;
    uVar83 = (psStack_248->v[0] & uStack_260) + (uVar79 & 0x3fffffff);
    uVar45 = (uStack_238 & uStack_260) + (uVar38 & 0x3fffffff);
    uVar49 = (ulong)uVar45;
    uVar79 = (uStack_23c & uStack_260) + (uVar76 & 0x3fffffff);
    uVar59 = (ulong)uVar79;
    uVar38 = ((int)uVar83 >> 0x1e) + (uStack_230 & uStack_260) + (uVar86 & 0x3fffffff);
    uVar76 = ((int)uVar38 >> 0x1e) + (uStack_258 & uStack_260) + (uVar55 & 0x3fffffff);
    uVar67 = ((int)uVar76 >> 0x1e) + (uStack_254 & uStack_260) + (uVar88 & 0x3fffffff);
    uVar39 = ((int)uVar67 >> 0x1e) + (uStack_234 & uStack_260) + (uVar71 & 0x3fffffff);
    uVar45 = ((int)uVar39 >> 0x1e) + uVar45;
    uVar79 = ((int)uVar45 >> 0x1e) + uVar79;
    uVar71 = ((int)uVar79 >> 0x1e) + (uStack_250 & uStack_260) + (uVar44 & 0x3fffffff);
    uVar44 = ((int)uVar71 >> 0x1e) + (uStack_24c & uStack_260) + uVar80;
    uVar43 = (ulong)uVar44;
    uVar67 = uVar67 & 0x3fffffff;
    a_00 = (secp256k1_fe *)(ulong)uVar67;
    uVar39 = uVar39 & 0x3fffffff;
    psVar62 = (secp256k1_modinv32_signed30 *)(ulong)uVar39;
    uVar71 = uVar71 & 0x3fffffff;
    uVar81 = (ulong)uVar71;
    a_03->v[0] = uVar83 & 0x3fffffff;
    a_03->v[1] = uVar38 & 0x3fffffff;
    a_03->v[2] = uVar76 & 0x3fffffff;
    a_03->v[3] = uVar67;
    a_03->v[4] = uVar39;
    a_03->v[5] = uVar45 & 0x3fffffff;
    a_03->v[6] = uVar79 & 0x3fffffff;
    a_03->v[7] = uVar71;
    a_03->v[8] = uVar44;
    if (0x3fffffff < uVar44) goto LAB_0015660f;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_268 = (code *)0x1565cd;
    psVar62 = a_03;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_248,0);
    if (iVar37 < 0) goto LAB_00156614;
    a_00 = (secp256k1_fe *)0x9;
    pcStack_268 = (code *)0x1565e8;
    psVar62 = a_03;
    iVar37 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_248,1);
    if (iVar37 < 0) {
      return;
    }
  }
  pcStack_268 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  psStack_300 = (secp256k1_fe *)secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    psStack_300 = (secp256k1_fe *)secp256k1_fe_inv;
  }
  pcStack_350 = (code *)0x156655;
  uStack_290 = uVar81;
  uStack_288 = uVar58;
  uStack_280 = uVar59;
  psStack_278 = a_03;
  uStack_270 = uVar49;
  pcStack_268 = (code *)uVar43;
  (*(code *)psStack_300)(&sStack_338);
  if (psVar62 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar62->v + 8) = sStack_338.n[4];
    *(ulong *)(psVar62[1].v + 1) = CONCAT44(sStack_338.normalized,sStack_338.magnitude);
    *(uint64_t *)(psVar62->v + 4) = sStack_338.n[2];
    *(uint64_t *)(psVar62->v + 6) = sStack_338.n[3];
    *(uint64_t *)psVar62->v = sStack_338.n[0];
    *(uint64_t *)(psVar62->v + 2) = sStack_338.n[1];
  }
  uVar89 = 0xfffffffffffff;
  uVar43 = 0xf000000000000;
  uVar59 = 0xffffffffffff;
  uVar81 = 0x1000003d0;
  sStack_2c8.n[0] = a_00->n[0];
  sStack_2c8.n[1] = a_00->n[1];
  sStack_2c8.n[2] = a_00->n[2];
  sStack_2c8.n[3] = a_00->n[3];
  sStack_2c8.n[4] = a_00->n[4];
  sStack_2c8.magnitude = a_00->magnitude;
  sStack_2c8.normalized = a_00->normalized;
  a_04 = &sStack_2c8;
  pcStack_350 = (code *)0x1566cc;
  secp256k1_fe_verify(a_04);
  lStack_340 = 0x1000003d1;
  uVar58 = (sStack_2c8.n[4] >> 0x30) * 0x1000003d1 + sStack_2c8.n[0];
  if (((uVar58 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar58 & 0xfffffffffffff) == 0)) {
    uVar49 = (uVar58 >> 0x34) + sStack_2c8.n[1];
    uVar61 = (uVar49 >> 0x34) + sStack_2c8.n[2];
    uVar64 = (uVar61 >> 0x34) + sStack_2c8.n[3];
    uVar65 = (uVar64 >> 0x34) + (sStack_2c8.n[4] & 0xffffffffffff);
    if ((((uVar49 | uVar58 | uVar61 | uVar64) & 0xfffffffffffff) != 0 || uVar65 != 0) &&
       (((uVar58 | 0x1000003d0) & uVar49 & uVar61 & uVar64 & (uVar65 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0015676f;
LAB_00156b83:
    a_00 = &sStack_338;
    pcStack_350 = (code *)0x156b90;
    secp256k1_fe_verify(a_00);
    uVar59 = uVar59 & sStack_338.n[4];
    uVar58 = (sStack_338.n[4] >> 0x30) * lStack_340 + sStack_338.n[0];
    uVar49 = (uVar58 >> 0x34) + sStack_338.n[1];
    uVar61 = (uVar49 >> 0x34) + sStack_338.n[2];
    a_01 = (secp256k1_fe *)((uVar61 >> 0x34) + sStack_338.n[3]);
    uVar64 = ((ulong)a_01 >> 0x34) + uVar59;
    if ((((uVar49 | uVar58 | uVar61 | (ulong)a_01) & uVar89) == 0 && uVar64 == 0) ||
       (r_00 = (secp256k1_fe *)(uVar64 ^ uVar43),
       ((uVar58 ^ uVar81) & uVar49 & uVar61 & (ulong)a_01 & (ulong)r_00) == uVar89)) {
      return;
    }
  }
  else {
LAB_0015676f:
    pcStack_350 = (code *)0x156787;
    a_01 = a_00;
    secp256k1_fe_mul(&sStack_2c8,a_00,&sStack_338);
    pcStack_350 = (code *)0x15678f;
    secp256k1_fe_verify(&sStack_2c8);
    r_00 = &fe_minus_one;
    pcStack_350 = (code *)0x15679b;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_2c8.magnitude < 0x20) {
      sStack_2c8.n[0] = sStack_2c8.n[0] + 0xffffefffffc2e;
      sStack_2c8.n[1] = sStack_2c8.n[1] + 0xfffffffffffff;
      sStack_2c8.n[2] = sStack_2c8.n[2] + 0xfffffffffffff;
      sStack_2c8.n[3] = sStack_2c8.n[3] + 0xfffffffffffff;
      sStack_2c8.n[4] = sStack_2c8.n[4] + 0xffffffffffff;
      sStack_2c8.normalized = 0;
      sStack_2c8.magnitude = sStack_2c8.magnitude + 1;
      pcStack_350 = (code *)0x1567f0;
      secp256k1_fe_verify(&sStack_2c8);
      pcStack_350 = (code *)0x1567f8;
      secp256k1_fe_verify(&sStack_2c8);
      uVar58 = (sStack_2c8.n[4] >> 0x30) * lStack_340 + sStack_2c8.n[0];
      uVar59 = (uVar58 >> 0x34) + sStack_2c8.n[1];
      uVar49 = (uVar59 >> 0x34) + sStack_2c8.n[2];
      a_01 = (secp256k1_fe *)((uVar49 >> 0x34) + sStack_2c8.n[3]);
      uVar61 = ((ulong)a_01 >> 0x34) + (sStack_2c8.n[4] & 0xffffffffffff);
      if ((((uVar59 | uVar58 | uVar49 | (ulong)a_01) & 0xfffffffffffff) != 0 || uVar61 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar61 ^ 0xf000000000000),
         ((uVar58 ^ 0x1000003d0) & uVar59 & uVar49 & (ulong)a_01 & (ulong)r_00) != 0xfffffffffffff))
      goto LAB_00156c11;
      sStack_2f8.n[0] = a_00->n[0];
      sStack_2f8.n[1] = a_00->n[1];
      sStack_2f8.n[2] = a_00->n[2];
      sStack_2f8.n[3] = a_00->n[3];
      sStack_2f8.n[4] = a_00->n[4];
      sStack_2f8.magnitude = a_00->magnitude;
      sStack_2f8.normalized = a_00->normalized;
      a_00 = &sStack_2f8;
      pcStack_350 = (code *)0x156890;
      secp256k1_fe_verify(a_00);
      r_00 = &fe_minus_one;
      pcStack_350 = (code *)0x15689c;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_2f8.magnitude) goto LAB_00156c16;
      uVar60 = sStack_2f8.n[0] + 0xffffefffffc2e;
      uVar87 = sStack_2f8.n[1] + 0xfffffffffffff;
      uVar89 = sStack_2f8.n[2] + 0xfffffffffffff;
      uVar43 = sStack_2f8.n[3] + 0xfffffffffffff;
      uVar81 = sStack_2f8.n[4] + 0xffffffffffff;
      sStack_2f8.normalized = 0;
      sStack_2f8.magnitude = sStack_2f8.magnitude + 1;
      pcStack_350 = (code *)0x156911;
      sStack_2f8.n[0] = uVar60;
      sStack_2f8.n[1] = uVar87;
      sStack_2f8.n[2] = uVar89;
      sStack_2f8.n[3] = uVar43;
      sStack_2f8.n[4] = uVar81;
      secp256k1_fe_verify(&sStack_2f8);
      pcStack_350 = (code *)0x156919;
      secp256k1_fe_verify(&sStack_2f8);
      a_04 = psStack_300;
      uVar58 = (uVar81 >> 0x30) * lStack_340 + uVar60;
      if (((uVar58 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar58 & 0xfffffffffffff) == 0)) {
        uVar81 = uVar81 & 0xffffffffffff;
        uVar64 = uVar87 + (uVar58 >> 0x34);
        uVar59 = (uVar64 >> 0x34) + uVar89;
        uVar49 = (uVar59 >> 0x34) + uVar43;
        uVar61 = (uVar49 >> 0x34) + uVar81;
        if (((uVar64 | uVar58 | uVar59 | uVar49) & 0xfffffffffffff) == 0 && uVar61 == 0) {
          return;
        }
        if (((uVar58 | 0x1000003d0) & uVar64 & uVar59 & uVar49 & (uVar61 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return;
        }
      }
      a_01 = &sStack_2f8;
      pcStack_350 = (code *)0x1569d9;
      (*(code *)psStack_300)();
      a_00 = &sStack_338;
      pcStack_350 = (code *)0x1569e6;
      secp256k1_fe_verify(a_00);
      r_00 = &fe_minus_one;
      pcStack_350 = (code *)0x1569f2;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_338.magnitude) goto LAB_00156c1b;
      a_00 = &sStack_338;
      sStack_338.n[0] = sStack_338.n[0] + 0xffffefffffc2e;
      sStack_338.n[1] = sStack_338.n[1] + 0xfffffffffffff;
      sStack_338.n[2] = sStack_338.n[2] + 0xfffffffffffff;
      sStack_338.n[3] = sStack_338.n[3] + 0xfffffffffffff;
      sStack_338.n[4] = sStack_338.n[4] + 0xffffffffffff;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      uVar59 = 0;
      sStack_338.normalized = 0;
      pcStack_350 = (code *)0x156a3b;
      secp256k1_fe_verify(a_00);
      pcStack_350 = (code *)0x156a44;
      a_01 = a_00;
      (*(code *)a_04)(a_00);
      pcStack_350 = (code *)0x156a4c;
      secp256k1_fe_verify(a_00);
      sStack_338.n[0] = sStack_338.n[0] + 1;
      sStack_338.magnitude = sStack_338.magnitude + 1;
      sStack_338.normalized = 0;
      pcStack_350 = (code *)0x156a5d;
      secp256k1_fe_verify(a_00);
      pcStack_350 = (code *)0x156a65;
      secp256k1_fe_verify(a_00);
      a_04 = &sStack_2f8;
      pcStack_350 = (code *)0x156a72;
      r_00 = a_04;
      secp256k1_fe_verify(a_04);
      if (sStack_2f8.magnitude + sStack_338.magnitude < 0x21) {
        sStack_338.n[0] = sStack_338.n[0] + sStack_2f8.n[0];
        sStack_338.n[1] = sStack_338.n[1] + sStack_2f8.n[1];
        sStack_338.n[2] = sStack_338.n[2] + sStack_2f8.n[2];
        sStack_338.n[3] = sStack_338.n[3] + sStack_2f8.n[3];
        sStack_338.n[4] = sStack_338.n[4] + sStack_2f8.n[4];
        sStack_338.normalized = 0;
        pcStack_350 = (code *)0x156ac0;
        sStack_338.magnitude = sStack_2f8.magnitude + sStack_338.magnitude;
        secp256k1_fe_verify(&sStack_338);
        pcStack_350 = (code *)0x156ac8;
        secp256k1_fe_verify(&sStack_338);
        uVar58 = (sStack_338.n[4] >> 0x30) * lStack_340 + sStack_338.n[0];
        if (((uVar58 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar58 & 0xfffffffffffff) == 0)) {
          uVar49 = (uVar58 >> 0x34) + sStack_338.n[1];
          uVar61 = (uVar49 >> 0x34) + sStack_338.n[2];
          uVar64 = (uVar61 >> 0x34) + sStack_338.n[3];
          uVar65 = (uVar64 >> 0x34) + (sStack_338.n[4] & 0xffffffffffff);
          if (((uVar49 | uVar58 | uVar61 | uVar64) & 0xfffffffffffff) == 0 && uVar65 == 0) {
            return;
          }
          if (((uVar58 | 0x1000003d0) & uVar49 & uVar61 & uVar64 & (uVar65 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return;
          }
        }
        pcStack_350 = (code *)0x156b83;
        test_inverse_field_cold_2();
        goto LAB_00156b83;
      }
    }
    else {
      pcStack_350 = (code *)0x156c11;
      test_inverse_field_cold_7();
LAB_00156c11:
      pcStack_350 = (code *)0x156c16;
      test_inverse_field_cold_6();
LAB_00156c16:
      a_04 = &sStack_2c8;
      pcStack_350 = (code *)0x156c1b;
      test_inverse_field_cold_5();
LAB_00156c1b:
      uVar59 = 0xffffffffffff;
      pcStack_350 = (code *)0x156c20;
      test_inverse_field_cold_4();
    }
    pcStack_350 = (code *)0x156c25;
    test_inverse_field_cold_3();
  }
  pcStack_350 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcVar90 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar90 = secp256k1_scalar_inverse;
  }
  r = (secp256k1_fe *)auStack_400;
  pcStack_418 = (code *)0x156c60;
  r_01 = r;
  sStack_398.n[4] = (uint64_t)a_00;
  sStack_398._40_8_ = uVar81;
  uStack_368 = uVar43;
  psStack_360 = a_04;
  uStack_358 = uVar89;
  pcStack_350 = (code *)uVar59;
  uVar40 = (*pcVar90)();
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_400._20_4_,auStack_400._16_4_);
    r_00->n[3] = CONCAT44(auStack_400._28_4_,auStack_400._24_4_);
    r_00->n[0] = CONCAT44(auStack_400._4_4_,auStack_400._0_4_);
    r_00->n[1] = CONCAT44(auStack_400._12_4_,auStack_400._8_4_);
  }
  uVar71 = 0;
  uVar76 = 0;
  uVar44 = 0;
  uVar67 = 0;
  auVar94._0_4_ = -(uint)((int)a_01->n[2] == 0 && (int)a_01->n[0] == 0);
  auVar94._4_4_ = -(uint)(*(int *)((long)a_01->n + 0x14) == 0 && *(int *)((long)a_01->n + 4) == 0);
  auVar94._8_4_ = -(uint)((int)a_01->n[3] == 0 && (int)a_01->n[1] == 0);
  auVar94._12_4_ =
       -(uint)(*(int *)((long)a_01->n + 0x1c) == 0 && *(int *)((long)a_01->n + 0xc) == 0);
  uVar38 = movmskps(uVar40,auVar94);
  uVar38 = uVar38 ^ 0xf;
  if (uVar38 != 0) {
    uVar58 = a_01->n[0];
    uVar59 = a_01->n[1];
    uVar49 = a_01->n[2];
    uVar54 = CONCAT44(auStack_400._4_4_,auStack_400._0_4_);
    uVar81 = CONCAT44(auStack_400._12_4_,auStack_400._8_4_);
    uVar43 = CONCAT44(auStack_400._20_4_,auStack_400._16_4_);
    r_00 = (secp256k1_fe *)CONCAT44(auStack_400._28_4_,auStack_400._24_4_);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar58;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar54;
    uVar50 = SUB168(auVar4 * auVar20,8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar50;
    sStack_3e0.n[0] = SUB168(auVar4 * auVar20,0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar58;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar81;
    auVar5 = auVar5 * auVar21;
    uVar66 = SUB168(auVar5 + auVar36,0);
    uVar68 = SUB168(auVar5 + auVar36,8);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar59;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar54;
    uVar51 = SUB168(auVar6 * auVar22,8);
    uVar65 = SUB168(auVar6 * auVar22,0);
    uVar61 = (ulong)CARRY8(uVar66,uVar65);
    uVar64 = uVar68 + uVar51;
    uVar69 = uVar64 + uVar61;
    uVar72 = (ulong)CARRY8(auVar5._8_8_,(ulong)CARRY8(uVar50,auVar5._0_8_)) +
             (ulong)(CARRY8(uVar68,uVar51) || CARRY8(uVar64,uVar61));
    sStack_3e0.n[1] = uVar66 + uVar65;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar58;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar43;
    uVar52 = SUB168(auVar7 * auVar23,8);
    uVar61 = SUB168(auVar7 * auVar23,0);
    uVar65 = uVar69 + uVar61;
    uVar61 = (ulong)CARRY8(uVar69,uVar61);
    uVar50 = uVar72 + uVar52;
    uVar73 = uVar50 + uVar61;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar59;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar81;
    uVar69 = SUB168(auVar8 * auVar24,8);
    uVar64 = SUB168(auVar8 * auVar24,0);
    uVar70 = uVar65 + uVar64;
    uVar64 = (ulong)CARRY8(uVar65,uVar64);
    uVar51 = uVar73 + uVar69;
    uVar74 = uVar51 + uVar64;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar49;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar54;
    uVar53 = SUB168(auVar9 * auVar25,8);
    uVar68 = SUB168(auVar9 * auVar25,0);
    uVar65 = (ulong)CARRY8(uVar70,uVar68);
    uVar66 = uVar74 + uVar53;
    uVar75 = uVar66 + uVar65;
    uVar72 = (ulong)(CARRY8(uVar72,uVar52) || CARRY8(uVar50,uVar61)) +
             (ulong)(CARRY8(uVar73,uVar69) || CARRY8(uVar51,uVar64)) +
             (ulong)(CARRY8(uVar74,uVar53) || CARRY8(uVar66,uVar65));
    sStack_3e0.n[2] = uVar70 + uVar68;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar58;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = r_00;
    uVar68 = SUB168(auVar10 * auVar26,8);
    uVar58 = SUB168(auVar10 * auVar26,0);
    uVar64 = uVar75 + uVar58;
    uVar58 = (ulong)CARRY8(uVar75,uVar58);
    uVar50 = uVar72 + uVar68;
    uVar70 = uVar50 + uVar58;
    pcVar91 = (code *)a_01->n[3];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar59;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar43;
    uVar52 = SUB168(auVar11 * auVar27,8);
    uVar61 = SUB168(auVar11 * auVar27,0);
    uVar65 = uVar64 + uVar61;
    uVar61 = (ulong)CARRY8(uVar64,uVar61);
    uVar51 = uVar70 + uVar52;
    uVar73 = uVar51 + uVar61;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar49;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar81;
    uVar69 = SUB168(auVar12 * auVar28,8);
    uVar64 = SUB168(auVar12 * auVar28,0);
    uVar75 = uVar65 + uVar64;
    uVar64 = (ulong)CARRY8(uVar65,uVar64);
    uVar66 = uVar73 + uVar69;
    uVar74 = uVar66 + uVar64;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pcVar91;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar54;
    uVar53 = SUB168(auVar13 * auVar29,8);
    uVar65 = SUB168(auVar13 * auVar29,0);
    sStack_3e0.n[3] = uVar75 + uVar65;
    uVar65 = (ulong)CARRY8(uVar75,uVar65);
    uVar54 = uVar74 + uVar53;
    uVar75 = uVar54 + uVar65;
    uVar68 = (ulong)(CARRY8(uVar72,uVar68) || CARRY8(uVar50,uVar58)) +
             (ulong)(CARRY8(uVar70,uVar52) || CARRY8(uVar51,uVar61)) +
             (ulong)(CARRY8(uVar73,uVar69) || CARRY8(uVar66,uVar64)) +
             (ulong)(CARRY8(uVar74,uVar53) || CARRY8(uVar54,uVar65));
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar59;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = r_00;
    uVar51 = SUB168(auVar14 * auVar30,8);
    uVar58 = SUB168(auVar14 * auVar30,0);
    uVar61 = uVar75 + uVar58;
    uVar58 = (ulong)CARRY8(uVar75,uVar58);
    uVar64 = uVar68 + uVar51;
    uVar52 = uVar64 + uVar58;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar49;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar43;
    uVar66 = SUB168(auVar15 * auVar31,8);
    uVar59 = SUB168(auVar15 * auVar31,0);
    uVar50 = uVar61 + uVar59;
    uVar59 = (ulong)CARRY8(uVar61,uVar59);
    uVar65 = uVar52 + uVar66;
    uVar69 = uVar65 + uVar59;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = pcVar91;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar81;
    uVar54 = SUB168(auVar16 * auVar32,8);
    uVar61 = SUB168(auVar16 * auVar32,0);
    sStack_3e0.n[4] = uVar50 + uVar61;
    uVar61 = (ulong)CARRY8(uVar50,uVar61);
    uVar50 = uVar69 + uVar54;
    uVar53 = uVar50 + uVar61;
    uVar50 = (ulong)(CARRY8(uVar68,uVar51) || CARRY8(uVar64,uVar58)) +
             (ulong)(CARRY8(uVar52,uVar66) || CARRY8(uVar65,uVar59)) +
             (ulong)(CARRY8(uVar69,uVar54) || CARRY8(uVar50,uVar61));
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar49;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = r_00;
    uVar64 = SUB168(auVar17 * auVar33,8);
    uVar58 = SUB168(auVar17 * auVar33,0);
    uVar61 = uVar53 + uVar58;
    uVar58 = (ulong)CARRY8(uVar53,uVar58);
    uVar49 = uVar50 + uVar64;
    uVar51 = uVar49 + uVar58;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = pcVar91;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar43;
    uVar65 = SUB168(auVar18 * auVar34,8);
    uVar59 = SUB168(auVar18 * auVar34,0);
    sStack_3e0._40_8_ = uVar61 + uVar59;
    uVar59 = (ulong)CARRY8(uVar61,uVar59);
    uVar61 = uVar51 + uVar65;
    auStack_3b0._8_8_ =
         (ulong)(CARRY8(uVar50,uVar64) || CARRY8(uVar49,uVar58)) +
         (ulong)(CARRY8(uVar51,uVar65) || CARRY8(uVar61,uVar59));
    auStack_3b0._0_8_ = uVar61 + uVar59;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = pcVar91;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = r_00;
    auStack_3b0 = auVar19 * auVar35 + auStack_3b0;
    r = &sStack_398;
    pcStack_418 = (code *)0x156dfb;
    r_01 = r;
    pcStack_408 = pcVar90;
    secp256k1_scalar_reduce_512((secp256k1_scalar *)r,(uint64_t *)(auStack_400 + 0x20));
    if (((sStack_398.n[0] != 1 || sStack_398.n[1] != 0) || sStack_398.n[2] != 0) ||
        sStack_398.n[3] != 0) {
      pcStack_418 = (code *)0x156ef2;
      test_inverse_scalar_cold_1();
      goto LAB_00156ef2;
    }
    pcStack_418 = (code *)0x156e2b;
    iVar37 = secp256k1_scalar_add
                       ((secp256k1_scalar *)(auStack_400 + 0x20),(secp256k1_scalar *)a_01,
                        &scalar_minus_one);
    pcVar90 = pcStack_408;
    auVar93._0_4_ = -(uint)((int)sStack_3e0.n[2] == 0 && (int)sStack_3e0.n[0] == 0);
    auVar93._4_4_ = -(uint)(sStack_3e0.n[2]._4_4_ == 0 && sStack_3e0.n[0]._4_4_ == 0);
    auVar93._8_4_ = -(uint)((int)sStack_3e0.n[3] == 0 && (int)sStack_3e0.n[1] == 0);
    auVar93._12_4_ = -(uint)(sStack_3e0.n[3]._4_4_ == 0 && sStack_3e0.n[1]._4_4_ == 0);
    iVar37 = movmskps(iVar37,auVar93);
    if (iVar37 == 0xf) {
      return;
    }
    r = (secp256k1_fe *)(auStack_400 + 0x20);
    pcStack_418 = (code *)0x156e5b;
    (*pcStack_408)(r,r);
    r_00 = (secp256k1_fe *)auStack_400;
    pcStack_418 = (code *)0x156e72;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,&scalar_minus_one,(secp256k1_scalar *)r_00);
    pcStack_418 = (code *)0x156e7b;
    (*pcVar90)(r_00,r_00);
    pcStack_418 = (code *)0x156e8d;
    secp256k1_scalar_add((secp256k1_scalar *)r_00,(secp256k1_scalar *)r_00,&secp256k1_scalar_one);
    pcStack_418 = (code *)0x156e9b;
    r_01 = r_00;
    iVar37 = secp256k1_scalar_add
                       ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)r_00);
    auVar95._0_4_ = -(uint)(auStack_400._16_4_ == 0 && auStack_400._0_4_ == 0);
    auVar95._4_4_ = -(uint)(auStack_400._20_4_ == 0 && auStack_400._4_4_ == 0);
    auVar95._8_4_ = -(uint)(auStack_400._24_4_ == 0 && auStack_400._8_4_ == 0);
    auVar95._12_4_ = -(uint)(auStack_400._28_4_ == 0 && auStack_400._12_4_ == 0);
    iVar37 = movmskps(iVar37,auVar95);
    if (iVar37 == 0xf) {
      return;
    }
    pcStack_418 = (code *)0x156ebf;
    test_inverse_scalar_cold_2();
    uVar38 = extraout_EAX;
    uVar71 = extraout_XMM0_Da;
    uVar76 = extraout_XMM0_Db;
    uVar44 = extraout_XMM0_Dc;
    uVar67 = extraout_XMM0_Dd;
  }
  auVar96._0_4_ = -(uint)((auStack_400._16_4_ | auStack_400._0_4_) == uVar71);
  auVar96._4_4_ = -(uint)((auStack_400._20_4_ | auStack_400._4_4_) == uVar76);
  auVar96._8_4_ = -(uint)((auStack_400._24_4_ | auStack_400._8_4_) == uVar44);
  auVar96._12_4_ = -(uint)((auStack_400._28_4_ | auStack_400._12_4_) == uVar67);
  iVar37 = movmskps(uVar38,auVar96);
  pcVar91 = pcVar90;
  if (iVar37 == 0xf) {
    return;
  }
LAB_00156ef2:
  pcStack_418 = random_fe;
  test_inverse_scalar_cold_3();
  psStack_438 = r;
  uStack_430 = uVar81;
  uStack_428 = uVar43;
  psStack_420 = r_00;
  pcStack_418 = pcVar91;
  while( true ) {
    secp256k1_testrand256(auStack_458);
    secp256k1_fe_impl_set_b32_mod(r_01,auStack_458);
    if (((r_01->n[0] < 0xffffefffffc2f) || (r_01->n[4] != 0xffffffffffff)) ||
       ((r_01->n[2] & r_01->n[3] & r_01->n[1]) != 0xfffffffffffff)) break;
    r_01->magnitude = -1;
  }
  r_01->magnitude = 1;
  r_01->normalized = 1;
  secp256k1_fe_verify(r_01);
  return;
}

Assistant:

static void secp256k1_modinv32(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, zeta=-1. */
    secp256k1_modinv32_signed30 d = {{0}};
    secp256k1_modinv32_signed30 e = {{1}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int i;
    int32_t zeta = -1; /* zeta = -(delta+1/2); delta is initially 1/2. */

    /* Do 20 iterations of 30 divsteps each = 600 divsteps. 590 suffices for 256-bit inputs. */
    for (i = 0; i < 20; ++i) {
        /* Compute transition matrix and new zeta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        zeta = secp256k1_modinv32_divsteps_30(zeta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv32_update_fg_30(&f, &g, &t);
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point sufficient iterations have been performed that g must have reached 0
     * and (if g was not originally 0) f must now equal +/- GCD of the initial f, g
     * values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, 9, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, 9, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  (secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv32_mul_cmp_30(&f, 9, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[8], modinfo);
    *x = d;
}